

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O3

void __thiscall
cmTcpIpConnection::cmTcpIpConnection
          (cmTcpIpConnection *this,int port,cmConnectionBufferStrategy *bufferStrategy)

{
  cmEventBasedConnection::cmEventBasedConnection(&this->super_cmEventBasedConnection,bufferStrategy)
  ;
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_0078bd40;
  this->Port = port;
  auto_handle_base_<uv_tcp_s>::auto_handle_base_((auto_handle_base_<uv_tcp_s> *)&this->ServerHandle)
  ;
  (this->ServerHandle).super_auto_handle_<uv_tcp_s>.super_auto_handle_base_<uv_tcp_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_0078af78;
  auto_handle_base_<uv_tcp_s>::auto_handle_base_((auto_handle_base_<uv_tcp_s> *)&this->ClientHandle)
  ;
  (this->ClientHandle).super_auto_handle_<uv_tcp_s>.super_auto_handle_base_<uv_tcp_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_0078af78;
  return;
}

Assistant:

cmTcpIpConnection::cmTcpIpConnection(
  int port, cmConnectionBufferStrategy* bufferStrategy)
  : cmEventBasedConnection(bufferStrategy)
  , Port(port)
{
}